

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[30],char_const*,char[12],unsigned_int,char[20],char_const*,char[46],char_const*,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [30],char **Args_1,
          char (*Args_2) [12],uint *Args_3,char (*Args_4) [20],char **Args_5,char (*Args_6) [46],
          char **Args_7,char (*Args_8) [3])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[30],char_const*,char[12],unsigned_int,char[20],char_const*,char[46],char_const*,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [30])this,(char **)Args,(char (*) [12])Args_1,(uint *)Args_2,
             (char (*) [20])Args_3,(char **)Args_4,(char (*) [46])Args_5,(char **)Args_6,
             (char (*) [3])Args_7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}